

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O3

FT_Error tt_face_load_maxp(TT_Face face,FT_Stream stream)

{
  FT_Error FVar1;
  
  FVar1 = (*face->goto_table)(face,0x6d617870,stream,(FT_ULong *)0x0);
  if (FVar1 == 0) {
    FVar1 = FT_Stream_ReadFields(stream,tt_face_load_maxp::maxp_fields,&face->max_profile);
    if (FVar1 == 0) {
      (face->max_profile).maxTwilightPoints = 0;
      (face->max_profile).maxStorage = 0;
      (face->max_profile).maxFunctionDefs = 0;
      (face->max_profile).maxInstructionDefs = 0;
      (face->max_profile).maxStackElements = 0;
      (face->max_profile).maxSizeOfInstructions = 0;
      (face->max_profile).maxComponentElements = 0;
      (face->max_profile).maxComponentDepth = 0;
      (face->max_profile).maxPoints = 0;
      (face->max_profile).maxContours = 0;
      (face->max_profile).maxCompositePoints = 0;
      (face->max_profile).maxCompositeContours = 0;
      (face->max_profile).maxZones = 0;
      (face->max_profile).maxTwilightPoints = 0;
      (face->max_profile).maxStorage = 0;
      (face->max_profile).maxFunctionDefs = 0;
      FVar1 = 0;
      if ((0xffff < (face->max_profile).version) &&
         (FVar1 = FT_Stream_ReadFields
                            (stream,tt_face_load_maxp::maxp_fields_extra,&face->max_profile),
         FVar1 == 0)) {
        if ((face->max_profile).maxFunctionDefs < 0x40) {
          (face->max_profile).maxFunctionDefs = 0x40;
        }
        FVar1 = 0;
        if (0xfffb < (face->max_profile).maxTwilightPoints) {
          (face->max_profile).maxTwilightPoints = 0xfffb;
          FVar1 = 0;
        }
      }
    }
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_maxp( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error        error;
    TT_MaxProfile*  maxProfile = &face->max_profile;

    static const FT_Frame_Field  maxp_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_MaxProfile

      FT_FRAME_START( 6 ),
        FT_FRAME_LONG  ( version ),
        FT_FRAME_USHORT( numGlyphs ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  maxp_fields_extra[] =
    {
      FT_FRAME_START( 26 ),
        FT_FRAME_USHORT( maxPoints ),
        FT_FRAME_USHORT( maxContours ),
        FT_FRAME_USHORT( maxCompositePoints ),
        FT_FRAME_USHORT( maxCompositeContours ),
        FT_FRAME_USHORT( maxZones ),
        FT_FRAME_USHORT( maxTwilightPoints ),
        FT_FRAME_USHORT( maxStorage ),
        FT_FRAME_USHORT( maxFunctionDefs ),
        FT_FRAME_USHORT( maxInstructionDefs ),
        FT_FRAME_USHORT( maxStackElements ),
        FT_FRAME_USHORT( maxSizeOfInstructions ),
        FT_FRAME_USHORT( maxComponentElements ),
        FT_FRAME_USHORT( maxComponentDepth ),
      FT_FRAME_END
    };


    error = face->goto_table( face, TTAG_maxp, stream, 0 );
    if ( error )
      goto Exit;

    if ( FT_STREAM_READ_FIELDS( maxp_fields, maxProfile ) )
      goto Exit;

    maxProfile->maxPoints             = 0;
    maxProfile->maxContours           = 0;
    maxProfile->maxCompositePoints    = 0;
    maxProfile->maxCompositeContours  = 0;
    maxProfile->maxZones              = 0;
    maxProfile->maxTwilightPoints     = 0;
    maxProfile->maxStorage            = 0;
    maxProfile->maxFunctionDefs       = 0;
    maxProfile->maxInstructionDefs    = 0;
    maxProfile->maxStackElements      = 0;
    maxProfile->maxSizeOfInstructions = 0;
    maxProfile->maxComponentElements  = 0;
    maxProfile->maxComponentDepth     = 0;

    if ( maxProfile->version >= 0x10000L )
    {
      if ( FT_STREAM_READ_FIELDS( maxp_fields_extra, maxProfile ) )
        goto Exit;

      /* XXX: an adjustment that is necessary to load certain */
      /*      broken fonts like `Keystrokes MT' :-(           */
      /*                                                      */
      /*   We allocate 64 function entries by default when    */
      /*   the maxFunctionDefs value is smaller.              */

      if ( maxProfile->maxFunctionDefs < 64 )
        maxProfile->maxFunctionDefs = 64;

      /* we add 4 phantom points later */
      if ( maxProfile->maxTwilightPoints > ( 0xFFFFU - 4 ) )
      {
        FT_TRACE0(( "tt_face_load_maxp:"
                    " too much twilight points in `maxp' table;\n" ));
        FT_TRACE0(( "                  "
                    " some glyphs might be rendered incorrectly\n" ));

        maxProfile->maxTwilightPoints = 0xFFFFU - 4;
      }
    }

    FT_TRACE3(( "numGlyphs: %hu\n", maxProfile->numGlyphs ));

  Exit:
    return error;
  }